

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O1

string * __thiscall
cli::getPrettyVersion_abi_cxx11_(string *__return_storage_ptr__,cli *this,Version version)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    pcVar2 = "1.0";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettyVersion(ZAP::Version version)
	{
		switch (version)
		{
		case ZAP::Version::V1_0: return "1.0";
		default: return "Unknown";
		}
	}